

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::detail::Dispatch_Function::build_type_infos
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  pointer psVar1;
  bool bVar2;
  pointer pTVar3;
  pointer pTVar4;
  size_t i;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  pointer psVar8;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> param_types;
  
  psVar8 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 == psVar1) {
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,
               &((psVar8->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_types);
    bVar6 = false;
    while( true ) {
      psVar8 = psVar8 + 1;
      if (psVar8 == psVar1) break;
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                (&param_types,
                 &((psVar8->
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->m_types);
      pTVar4 = (__return_storage_ptr__->
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (__return_storage_ptr__->
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar6 = (bool)(bVar6 | (long)param_types.
                                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)param_types.
                                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                   ._M_impl.super__Vector_impl_data._M_start !=
                             (long)pTVar3 - (long)pTVar4);
      lVar7 = 0;
      for (uVar5 = 0;
          (uVar5 < (ulong)(((long)pTVar3 - (long)pTVar4) / 0x18) &&
          (uVar5 < (ulong)(((long)param_types.
                                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)param_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18)));
          uVar5 = uVar5 + 1) {
        bVar2 = Type_Info::operator==
                          ((Type_Info *)((long)&pTVar4->m_type_info + lVar7),
                           (Type_Info *)
                           ((long)&(param_types.
                                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar7)
                          );
        if (!bVar2) {
          pTVar4 = (__return_storage_ptr__->
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(pointer_____offset_0x10___ **)((long)&pTVar4->m_type_info + lVar7) =
               &Boxed_Value::typeinfo;
          *(pointer_____offset_0x10___ **)((long)&pTVar4->m_bare_type_info + lVar7) =
               &Boxed_Value::typeinfo;
          *(undefined4 *)((long)&pTVar4->m_flags + lVar7) = 0;
        }
        pTVar4 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar3 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar7 = lVar7 + 0x18;
      }
      std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
      ~_Vector_base(&param_types.
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   );
    }
    if ((__return_storage_ptr__->
        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!type_infos.empty() && \" type_info vector size is < 0, this is only possible if something else is broken\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/dispatchkit.hpp"
                    ,0x130,
                    "static std::vector<Type_Info> chaiscript::detail::Dispatch_Function::build_type_infos(const std::vector<Proxy_Function> &)"
                   );
    }
    if (bVar6) {
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::resize
                (__return_storage_ptr__,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_infos(const std::vector<Proxy_Function> &t_funcs) {
        auto begin = t_funcs.cbegin();
        const auto &end = t_funcs.cend();

        if (begin != end) {
          std::vector<Type_Info> type_infos = (*begin)->get_param_types();

          ++begin;

          bool size_mismatch = false;

          while (begin != end) {
            std::vector<Type_Info> param_types = (*begin)->get_param_types();

            if (param_types.size() != type_infos.size()) {
              size_mismatch = true;
            }

            for (size_t i = 0; i < type_infos.size() && i < param_types.size(); ++i) {
              if (!(type_infos[i] == param_types[i])) {
                type_infos[i] = detail::Get_Type_Info<Boxed_Value>::get();
              }
            }

            ++begin;
          }

          assert(!type_infos.empty() && " type_info vector size is < 0, this is only possible if something else is broken");

          if (size_mismatch) {
            type_infos.resize(1);
          }

          return type_infos;
        }

        return std::vector<Type_Info>();
      }